

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O1

ConfidentialTxOutReference * __thiscall
cfd::ConfidentialTransactionController::AddTxOut
          (ConfidentialTxOutReference *__return_storage_ptr__,
          ConfidentialTransactionController *this,ElementsConfidentialAddress *address,Amount *value
          ,ConfidentialAssetId *asset,bool remove_nonce)

{
  uint32_t index;
  ByteData nonce;
  ByteData hash_data;
  Script locking_script;
  ElementsConfidentialAddress confidential_addr;
  string local_288;
  ByteData local_268;
  ConfidentialKey local_250;
  ByteData local_238;
  Script local_220;
  undefined1 local_1e8 [24];
  pointer local_1d0;
  pointer local_68;
  pointer local_58;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  core::ElementsConfidentialAddress::GetHash(&local_238,address);
  core::ElementsConfidentialAddress::GetLockingScript(&local_220,address);
  core::ByteData::ByteData(&local_268);
  if (!remove_nonce) {
    core::ElementsConfidentialAddress::GetAddress_abi_cxx11_(&local_288,address);
    core::ElementsConfidentialAddress::ElementsConfidentialAddress
              ((ElementsConfidentialAddress *)local_1e8,&local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    core::ElementsConfidentialAddress::GetConfidentialKey
              (&local_250,(ElementsConfidentialAddress *)local_1e8);
    core::Pubkey::GetData((ByteData *)&local_288,&local_250);
    core::ByteData::operator=(&local_268,(ByteData *)&local_288);
    if (local_288._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_288._M_dataplus._M_p,
                      local_288.field_2._M_allocated_capacity - (long)local_288._M_dataplus._M_p);
    }
    if (local_250.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_250.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_250.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_250.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
    }
    if (local_68 != (pointer)0x0) {
      operator_delete(local_68,(long)local_58 - (long)local_68);
    }
    core::Address::~Address((Address *)local_1e8);
  }
  core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_1e8,&local_268);
  index = core::ConfidentialTransaction::AddTxOut
                    (&this->transaction_,value,asset,&local_220,(ConfidentialNonce *)local_1e8);
  core::ConfidentialTransaction::GetTxOut(__return_storage_ptr__,&this->transaction_,index);
  local_1e8._0_8_ = &PTR__ConfidentialNonce_0087cc78;
  if ((pointer)local_1e8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1e8._8_8_,(long)local_1d0 - local_1e8._8_8_);
  }
  if (local_268.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_268.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_268.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  core::Script::~Script(&local_220);
  if (local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_238.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_238.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

const ConfidentialTxOutReference ConfidentialTransactionController::AddTxOut(
    const ElementsConfidentialAddress& address, const Amount& value,
    const ConfidentialAssetId& asset, bool remove_nonce) {
  const ByteData hash_data = address.GetHash();
  Script locking_script = address.GetLockingScript();

  ByteData nonce;
  if (!remove_nonce) {
    ElementsConfidentialAddress confidential_addr(address.GetAddress());
    nonce = confidential_addr.GetConfidentialKey().GetData();
  }
  return AddTxOut(locking_script, value, asset, ConfidentialNonce(nonce));
}